

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuValuesInParamsGenerator<unsigned_long>::
iuValuesInParamsGenerator<unsigned_long,3ul>
          (iuValuesInParamsGenerator<unsigned_long> *this,unsigned_long (*values) [3])

{
  params_t *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_28;
  const_iterator local_20;
  unsigned_long (*local_18) [3];
  unsigned_long (*values_local) [3];
  iuValuesInParamsGenerator<unsigned_long> *this_local;
  
  local_18 = values;
  values_local = (unsigned_long (*) [3])this;
  iuIParamGenerator<unsigned_long>::iuIParamGenerator(&this->super_iuIParamGenerator<unsigned_long>)
  ;
  (this->super_iuIParamGenerator<unsigned_long>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuValuesInParamsGenerator_001f14d0;
  this_00 = &this->m_values;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_00);
  __gnu_cxx::
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::__normal_iterator(&this->m_it);
  local_28._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_20,&local_28);
  std::vector<unsigned_long,std::allocator<unsigned_long>>::insert<unsigned_long_const*,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,local_20,*local_18,
             local_18[1]);
  return;
}

Assistant:

explicit iuValuesInParamsGenerator(const TT (&values)[SIZE])
    {
        m_values.insert(m_values.end(), values, values + SIZE);
    }